

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Pipeline::Clear(Pipeline *this)

{
  uint32_t cached_has_bits;
  Pipeline *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Clear(&this->models_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->names_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Pipeline::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.Pipeline)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  models_.Clear();
  names_.Clear();
  _internal_metadata_.Clear<std::string>();
}